

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O2

bool cmTargetCompileFeaturesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  allocator<char> local_71;
  string local_70;
  cmTargetPropCommandBase local_50;
  
  cmTargetPropCommandBase::cmTargetPropCommandBase(&local_50,status);
  local_50._vptr_cmTargetPropCommandBase = (_func_int **)&PTR__cmTargetPropCommandBase_00929db0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"COMPILE_FEATURES",&local_71);
  bVar1 = cmTargetPropCommandBase::HandleArguments(&local_50,args,&local_70,0);
  std::__cxx11::string::~string((string *)&local_70);
  cmTargetPropCommandBase::~cmTargetPropCommandBase(&local_50);
  return bVar1;
}

Assistant:

bool cmTargetCompileFeaturesCommand(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  return TargetCompileFeaturesImpl(status).HandleArguments(args,
                                                           "COMPILE_FEATURES");
}